

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standalone_tests.c
# Opt level: O1

void C_A_T_C_H_T_E_S_T_12(void)

{
  long lVar1;
  int *test2;
  Test *test;
  AssertionHandler catchAssertionHandler;
  long local_150;
  long local_148;
  SourceLineInfo local_140;
  AssertionHandler local_130 [58];
  char local_f6;
  long *local_f0;
  undefined1 local_e8 [16];
  long *local_d8;
  char *local_d0;
  size_t sStack_c8;
  long *local_c0;
  undefined8 local_b8;
  StringRef local_b0;
  StringRef local_a0;
  StringRef local_90;
  StringRef local_80;
  StringRef local_70;
  StringRef local_60;
  StringRef local_50;
  StringRef local_40;
  
  local_148 = 0;
  local_e8._0_8_ = "REQUIRE";
  local_e8._8_8_ = 7;
  local_140.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/standalone_tests.c"
  ;
  local_140.line = 0x58;
  Catch::StringRef::StringRef(&local_40,"test == __null");
  Catch::AssertionHandler::AssertionHandler
            (local_130,(StringRef *)local_e8,&local_140,local_40,Normal);
  lVar1 = local_148;
  local_150 = 0;
  Catch::StringRef::StringRef((StringRef *)&local_140,"==");
  local_e8[9] = lVar1 == 0;
  local_e8[8] = 1;
  local_e8._0_8_ = &PTR_streamReconstructedExpression_00123c58;
  local_d0 = local_140.file;
  sStack_c8 = local_140.line;
  local_d8 = &local_148;
  local_c0 = &local_150;
  Catch::AssertionHandler::handleExpr((ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_e8);
  Catch::AssertionHandler::complete();
  if (local_f6 == '\0') {
    (**(code **)(*local_f0 + 0x70))();
  }
  local_e8._0_8_ = "REQUIRE";
  local_e8._8_8_ = 7;
  local_140.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/standalone_tests.c"
  ;
  local_140.line = 0x59;
  Catch::StringRef::StringRef(&local_50,"test == nullptr");
  Catch::AssertionHandler::AssertionHandler
            (local_130,(StringRef *)local_e8,&local_140,local_50,Normal);
  lVar1 = local_148;
  local_150 = 0;
  Catch::StringRef::StringRef((StringRef *)&local_140,"==");
  local_e8[9] = lVar1 == 0;
  local_e8[8] = 1;
  local_e8._0_8_ = &PTR_streamReconstructedExpression_00123c98;
  local_d8 = &local_148;
  local_d0 = local_140.file;
  sStack_c8 = local_140.line;
  local_c0 = &local_150;
  Catch::AssertionHandler::handleExpr((ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_e8);
  Catch::AssertionHandler::complete();
  if (local_f6 == '\0') {
    (**(code **)(*local_f0 + 0x70))();
  }
  local_148 = 0;
  local_e8._0_8_ = "REQUIRE";
  local_e8._8_8_ = 7;
  local_140.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/standalone_tests.c"
  ;
  local_140.line = 0x5d;
  Catch::StringRef::StringRef(&local_60,"test == __null");
  Catch::AssertionHandler::AssertionHandler
            (local_130,(StringRef *)local_e8,&local_140,local_60,Normal);
  lVar1 = local_148;
  local_150 = 0;
  Catch::StringRef::StringRef((StringRef *)&local_140,"==");
  local_e8[9] = lVar1 == 0;
  local_e8[8] = 1;
  local_e8._0_8_ = &PTR_streamReconstructedExpression_00123c58;
  local_d8 = &local_148;
  local_d0 = local_140.file;
  sStack_c8 = local_140.line;
  local_c0 = &local_150;
  Catch::AssertionHandler::handleExpr((ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_e8);
  Catch::AssertionHandler::complete();
  if (local_f6 == '\0') {
    (**(code **)(*local_f0 + 0x70))();
  }
  local_e8._0_8_ = "REQUIRE";
  local_e8._8_8_ = 7;
  local_140.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/standalone_tests.c"
  ;
  local_140.line = 0x5e;
  Catch::StringRef::StringRef(&local_70,"test == nullptr");
  Catch::AssertionHandler::AssertionHandler
            (local_130,(StringRef *)local_e8,&local_140,local_70,Normal);
  lVar1 = local_148;
  local_150 = 0;
  Catch::StringRef::StringRef((StringRef *)&local_140,"==");
  local_e8[9] = lVar1 == 0;
  local_e8[8] = 1;
  local_e8._0_8_ = &PTR_streamReconstructedExpression_00123c98;
  local_d8 = &local_148;
  local_d0 = local_140.file;
  sStack_c8 = local_140.line;
  local_c0 = &local_150;
  Catch::AssertionHandler::handleExpr((ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_e8);
  Catch::AssertionHandler::complete();
  if (local_f6 == '\0') {
    (**(code **)(*local_f0 + 0x70))();
  }
  local_150 = 0;
  local_e8._0_8_ = "REQUIRE";
  local_e8._8_8_ = 7;
  local_140.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/standalone_tests.c"
  ;
  local_140.line = 0x62;
  Catch::StringRef::StringRef(&local_80,"test2 == __null");
  Catch::AssertionHandler::AssertionHandler
            (local_130,(StringRef *)local_e8,&local_140,local_80,Normal);
  lVar1 = local_150;
  local_b8 = 0;
  Catch::StringRef::StringRef((StringRef *)&local_140,"==");
  local_e8[9] = lVar1 == 0;
  local_e8[8] = 1;
  local_e8._0_8_ = &PTR_streamReconstructedExpression_00123cd8;
  local_d0 = local_140.file;
  sStack_c8 = local_140.line;
  local_d8 = &local_150;
  local_c0 = &local_b8;
  Catch::AssertionHandler::handleExpr((ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_e8);
  Catch::AssertionHandler::complete();
  if (local_f6 == '\0') {
    (**(code **)(*local_f0 + 0x70))();
  }
  local_e8._0_8_ = "REQUIRE";
  local_e8._8_8_ = 7;
  local_140.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/standalone_tests.c"
  ;
  local_140.line = 99;
  Catch::StringRef::StringRef(&local_90,"test2 == nullptr");
  Catch::AssertionHandler::AssertionHandler
            (local_130,(StringRef *)local_e8,&local_140,local_90,Normal);
  lVar1 = local_150;
  local_b8 = 0;
  Catch::StringRef::StringRef((StringRef *)&local_140,"==");
  local_e8[9] = lVar1 == 0;
  local_e8[8] = 1;
  local_e8._0_8_ = &PTR_streamReconstructedExpression_00123d18;
  local_d0 = local_140.file;
  sStack_c8 = local_140.line;
  local_d8 = &local_150;
  local_c0 = &local_b8;
  Catch::AssertionHandler::handleExpr((ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_e8);
  Catch::AssertionHandler::complete();
  if (local_f6 == '\0') {
    (**(code **)(*local_f0 + 0x70))();
  }
  local_150 = 0;
  local_e8._0_8_ = "REQUIRE";
  local_e8._8_8_ = 7;
  local_140.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/standalone_tests.c"
  ;
  local_140.line = 0x67;
  Catch::StringRef::StringRef(&local_a0,"test2 == __null");
  Catch::AssertionHandler::AssertionHandler
            (local_130,(StringRef *)local_e8,&local_140,local_a0,Normal);
  lVar1 = local_150;
  local_b8 = 0;
  Catch::StringRef::StringRef((StringRef *)&local_140,"==");
  local_e8[9] = lVar1 == 0;
  local_e8[8] = 1;
  local_e8._0_8_ = &PTR_streamReconstructedExpression_00123cd8;
  local_d0 = local_140.file;
  sStack_c8 = local_140.line;
  local_d8 = &local_150;
  local_c0 = &local_b8;
  Catch::AssertionHandler::handleExpr((ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_e8);
  Catch::AssertionHandler::complete();
  if (local_f6 == '\0') {
    (**(code **)(*local_f0 + 0x70))();
  }
  local_e8._0_8_ = "REQUIRE";
  local_e8._8_8_ = 7;
  local_140.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/standalone_tests.c"
  ;
  local_140.line = 0x68;
  Catch::StringRef::StringRef(&local_b0,"test2 == nullptr");
  Catch::AssertionHandler::AssertionHandler
            (local_130,(StringRef *)local_e8,&local_140,local_b0,Normal);
  lVar1 = local_150;
  local_b8 = 0;
  Catch::StringRef::StringRef((StringRef *)&local_140,"==");
  local_e8[9] = lVar1 == 0;
  local_e8[8] = 1;
  local_e8._0_8_ = &PTR_streamReconstructedExpression_00123d18;
  local_d0 = local_140.file;
  sStack_c8 = local_140.line;
  local_d8 = &local_150;
  local_c0 = &local_b8;
  Catch::AssertionHandler::handleExpr((ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_e8);
  Catch::AssertionHandler::complete();
  if (local_f6 == '\0') {
    (**(code **)(*local_f0 + 0x70))();
  }
  return;
}

Assistant:

class Test
	{
		Test()
		{
		}
	}